

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLABecLaplacian::Fapply
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  int iVar6;
  double *pdVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  double dVar29;
  MFIter mfi;
  int local_444;
  long local_440;
  long local_408;
  ulong local_3f8;
  ulong local_3e0;
  long local_3d8;
  long local_3c8;
  long local_3a8;
  long local_370;
  Box local_314;
  double *local_2f8;
  ulong uStack_2f0;
  Real local_2e0;
  ulong local_2d8;
  long local_2d0;
  FabArray<amrex::FArrayBox> *local_2c8;
  FabArray<amrex::FArrayBox> *local_2c0;
  FabArray<amrex::FArrayBox> *local_2b8;
  long local_2b0;
  FabArray<amrex::FArrayBox> *local_2a8;
  FabArray<amrex::FArrayBox> *local_2a0;
  MLABecLaplacian *local_298;
  FabArray<amrex::FArrayBox> *local_290;
  Array4<const_double> local_288;
  Array4<const_double> local_248;
  Array4<const_double> local_208;
  Array4<double> local_1c8;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  double local_108;
  ulong uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  lVar25 = (long)amrlev;
  lVar20 = (long)mglev;
  local_2a0 = (FabArray<amrex::FArrayBox> *)
              (lVar20 * 0x180 +
              *(long *)&(this->m_a_coeffs).
                        super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar25].
                        super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
  lVar15 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar25].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  lVar9 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar25].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar12 = lVar20 * 200;
  dVar29 = *(double *)(lVar9 + 0x38 + lVar12);
  local_2f8 = *(double **)(lVar9 + 0x40 + lVar12);
  uStack_2f0 = 0;
  dVar3 = *(double *)(lVar9 + 0x48 + lVar12);
  local_2e0 = this->m_a_scalar;
  dVar4 = this->m_b_scalar;
  local_298 = this;
  local_290 = &in->super_FabArray<amrex::FArrayBox>;
  uVar8 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_2a8 = &out->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)out,true);
  if (local_90.currentIndex < local_90.endIndex) {
    lVar9 = lVar20 * 0x480;
    local_2b8 = (FabArray<amrex::FArrayBox> *)(lVar15 + lVar9);
    local_2c0 = (FabArray<amrex::FArrayBox> *)(lVar15 + lVar9 + 0x180);
    local_2c8 = (FabArray<amrex::FArrayBox> *)(lVar15 + 0x300 + lVar9);
    uStack_f0 = 0x8000000000000000;
    local_f8 = -dVar29 * dVar4 * dVar29;
    uStack_100 = uStack_2f0 ^ 0x8000000000000000;
    local_108 = -(double)local_2f8 * dVar4 * (double)local_2f8;
    uStack_e0 = 0x8000000000000000;
    local_e8 = -dVar3 * dVar4 * dVar3;
    local_2d8 = (ulong)uVar8;
    local_2d0 = lVar25 * 3;
    local_2b0 = lVar20;
    do {
      lVar9 = local_2b0;
      lVar15 = local_2d0;
      MFIter::tilebox(&local_314,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_188,local_290,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1c8,local_2a8,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_148,local_2a0,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_208,local_2b8,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_248,local_2c0,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_288,local_2c8,&local_90);
      pVVar5 = (local_298->super_MLCellABecLap).m_overset_mask.
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
          *(tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
           &(&(pVVar5->
              super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              ).
              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)[lVar15][lVar9]._M_t ==
          (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x0) {
        if (0 < (int)uVar8) {
          lVar9 = (long)local_314.smallend.vect[1];
          lVar15 = (long)local_314.smallend.vect[0] * 8;
          local_3a8 = 0;
          local_3f8 = 0;
          do {
            iVar2 = local_314.smallend.vect[2];
            iVar6 = local_314.smallend.vect[2] + -1;
            local_444 = local_314.smallend.vect[2];
            if (local_314.smallend.vect[2] <= local_314.bigend.vect[2]) {
              do {
                local_444 = local_444 + 1;
                if (local_314.smallend.vect[1] <= local_314.bigend.vect[1]) {
                  lVar22 = (long)iVar2;
                  lVar13 = (long)local_188.begin.y;
                  lVar12 = local_188.jstride * 8;
                  lVar25 = (lVar9 - lVar13) * lVar12;
                  lVar18 = local_188.kstride * 8;
                  lVar20 = local_188.nstride * local_3a8;
                  lVar16 = (long)local_188.begin.x;
                  lVar23 = (lVar22 - local_188.begin.z) * lVar18 + lVar20;
                  lVar14 = (long)local_188.p +
                           (iVar6 - local_188.begin.z) * lVar18 + lVar25 + lVar20 + lVar16 * -8 +
                           lVar15;
                  lVar20 = (long)local_188.p +
                           ((long)local_444 - (long)local_188.begin.z) * lVar18 + lVar25 + lVar20 +
                           lVar16 * -8 + lVar15;
                  local_3d8 = (long)local_188.p + lVar25 + lVar23 + lVar16 * -8 + lVar15 + 8;
                  lVar19 = (long)local_188.p +
                           ((lVar9 + 1) - lVar13) * lVar12 + lVar23 + lVar16 * -8 + lVar15;
                  lVar26 = (long)local_208.p +
                           local_208.nstride * local_3a8 +
                           (lVar9 - local_208.begin.y) * local_208.jstride * 8 +
                           (lVar22 - local_208.begin.z) * local_208.kstride * 8 +
                           (long)local_208.begin.x * -8 + lVar15 + 8;
                  lVar25 = local_248.jstride * 8;
                  lVar18 = (lVar22 - local_248.begin.z) * local_248.kstride;
                  lVar24 = (long)local_248.p +
                           ((lVar9 + 1) - (long)local_248.begin.y) * lVar25 + lVar18 * 8 +
                           local_248.nstride * local_3a8 + (long)local_248.begin.x * -8 + lVar15;
                  lVar21 = (long)local_248.p +
                           (lVar9 - local_248.begin.y) * lVar25 + lVar18 * 8 +
                           local_248.nstride * local_3a8 + (long)local_248.begin.x * -8 + lVar15;
                  lVar18 = local_288.jstride * 8;
                  lVar10 = (lVar9 - local_288.begin.y) * lVar18;
                  lVar27 = (long)local_288.p +
                           (lVar22 - local_288.begin.z) * local_288.kstride * 8 + lVar10 +
                           local_288.nstride * local_3a8 + (long)local_288.begin.x * -8 + lVar15;
                  lVar10 = (long)local_288.p +
                           ((long)local_444 - (long)local_288.begin.z) * local_288.kstride * 8 +
                           lVar10 + local_288.nstride * local_3a8 + (long)local_288.begin.x * -8 +
                           lVar15;
                  lVar17 = (long)local_148.p +
                           (lVar9 - local_148.begin.y) * local_148.jstride * 8 +
                           (lVar22 - local_148.begin.z) * local_148.kstride * 8 +
                           (long)local_148.begin.x * -8 + lVar15;
                  iVar11 = (local_314.smallend.vect[1] + -1) - local_188.begin.y;
                  pdVar7 = (double *)
                           ((long)local_1c8.p +
                           local_1c8.nstride * local_3a8 +
                           (lVar9 - local_1c8.begin.y) * local_1c8.jstride * 8 +
                           (lVar22 - local_1c8.begin.z) * local_1c8.kstride * 8 +
                           (long)local_1c8.begin.x * -8 + lVar15);
                  local_3c8 = lVar9;
                  do {
                    local_2f8 = pdVar7;
                    if (local_314.smallend.vect[0] <= local_314.bigend.vect[0]) {
                      lVar22 = 0;
                      do {
                        dVar29 = *(double *)(local_3d8 + -8 + lVar22 * 8);
                        local_2f8[lVar22] =
                             ((*(double *)(lVar20 + lVar22 * 8) - dVar29) *
                              *(double *)(lVar10 + lVar22 * 8) -
                             (dVar29 - *(double *)(lVar14 + lVar22 * 8)) *
                             *(double *)(lVar27 + lVar22 * 8)) * local_e8 +
                             ((*(double *)(lVar19 + lVar22 * 8) - dVar29) *
                              *(double *)(lVar24 + lVar22 * 8) -
                             (dVar29 - *(double *)
                                        ((long)local_188.p +
                                        lVar22 * 8 + iVar11 * lVar12 + lVar23 + lVar16 * -8 + lVar15
                                        )) * *(double *)(lVar21 + lVar22 * 8)) * local_108 +
                             *(double *)(lVar17 + lVar22 * 8) * local_2e0 * dVar29 +
                             ((*(double *)(local_3d8 + lVar22 * 8) - dVar29) *
                              *(double *)(lVar26 + lVar22 * 8) -
                             (dVar29 - local_188.p
                                       [(local_3c8 - lVar13) * local_188.jstride +
                                        (iVar2 - local_188.begin.z) * local_188.kstride +
                                        local_188.nstride * local_3f8 +
                                        (long)(((local_314.smallend.vect[0] + -1) -
                                               local_188.begin.x) + (int)lVar22)]) *
                             *(double *)(lVar26 + -8 + lVar22 * 8)) * local_f8;
                        lVar22 = lVar22 + 1;
                      } while ((local_314.bigend.vect[0] - local_314.smallend.vect[0]) + 1 !=
                               (int)lVar22);
                    }
                    local_3c8 = local_3c8 + 1;
                    lVar14 = lVar14 + lVar12;
                    lVar20 = lVar20 + lVar12;
                    local_3d8 = local_3d8 + lVar12;
                    lVar19 = lVar19 + lVar12;
                    iVar11 = iVar11 + 1;
                    lVar26 = lVar26 + local_208.jstride * 8;
                    lVar24 = lVar24 + lVar25;
                    lVar21 = lVar21 + lVar25;
                    lVar27 = lVar27 + lVar18;
                    lVar10 = lVar10 + lVar18;
                    lVar17 = lVar17 + local_148.jstride * 8;
                    pdVar7 = local_2f8 + local_1c8.jstride;
                  } while (local_314.bigend.vect[1] + 1 != (int)local_3c8);
                }
                bVar28 = iVar2 != local_314.bigend.vect[2];
                iVar2 = iVar2 + 1;
                iVar6 = iVar6 + 1;
              } while (bVar28);
            }
            local_3f8 = local_3f8 + 1;
            local_3a8 = local_3a8 + 8;
          } while (local_3f8 != local_2d8);
        }
      }
      else {
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::IArrayBox> *)
                   (&(pVVar5->
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     ).
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)[lVar15][lVar9]._M_t,&local_90);
        if (0 < (int)uVar8) {
          lVar9 = (long)local_314.smallend.vect[1];
          lVar12 = (long)local_314.smallend.vect[0];
          lVar15 = lVar12 * 8;
          local_408 = 0;
          local_3e0 = 0;
          do {
            iVar6 = local_314.smallend.vect[2];
            iVar2 = local_314.smallend.vect[2] + -1;
            iVar11 = local_314.smallend.vect[2];
            if (local_314.smallend.vect[2] <= local_314.bigend.vect[2]) {
              do {
                iVar11 = iVar11 + 1;
                if (local_314.smallend.vect[1] <= local_314.bigend.vect[1]) {
                  lVar20 = (long)iVar6;
                  local_3d8 = (long)local_d0.p +
                              (lVar9 - local_d0.begin.y) * local_d0.jstride * 4 +
                              (lVar20 - local_d0.begin.z) * local_d0.kstride * 4 +
                              (long)local_d0.begin.x * -4 + lVar12 * 4;
                  local_440 = lVar9;
                  iVar1 = local_314.smallend.vect[1] + -1;
                  local_370 = lVar9;
                  do {
                    local_370 = local_370 + 1;
                    if (local_314.smallend.vect[0] <= local_314.bigend.vect[0]) {
                      lVar10 = (long)local_188.begin.x;
                      lVar21 = local_440 - local_188.begin.y;
                      local_2f8 = local_188.p +
                                  local_188.jstride * lVar21 +
                                  (iVar6 - local_188.begin.z) * local_188.kstride +
                                  local_188.nstride * local_3e0;
                      lVar19 = local_188.jstride * 8;
                      lVar21 = lVar21 * lVar19;
                      lVar13 = local_188.kstride * 8;
                      lVar16 = local_188.nstride * local_408;
                      lVar17 = (lVar20 - local_188.begin.z) * lVar13;
                      lVar25 = lVar21 + lVar17 + lVar16 + lVar10 * -8 + lVar15;
                      lVar18 = local_208.nstride * local_408 +
                               (lVar20 - local_208.begin.z) * local_208.kstride * 8 +
                               (local_440 - local_208.begin.y) * local_208.jstride * 8 +
                               (long)local_208.begin.x * -8 + lVar15;
                      lVar26 = (lVar20 - local_248.begin.z) * local_248.kstride;
                      lVar14 = (local_440 - local_288.begin.y) * local_288.jstride;
                      lVar23 = 0;
                      do {
                        if (*(int *)(local_3d8 + lVar23 * 4) == 0) {
                          dVar29 = 0.0;
                        }
                        else {
                          dVar29 = *(double *)((long)local_188.p + lVar23 * 8 + lVar25);
                          dVar29 = ((*(double *)
                                      ((long)local_188.p +
                                      lVar23 * 8 +
                                      ((long)iVar11 - (long)local_188.begin.z) * lVar13 + lVar21 +
                                      lVar16 + lVar10 * -8 + lVar15) - dVar29) *
                                    *(double *)
                                     ((long)local_288.p +
                                     lVar23 * 8 +
                                     lVar14 * 8 +
                                     ((long)iVar11 - (long)local_288.begin.z) *
                                     local_288.kstride * 8 + local_288.nstride * local_408 +
                                     (long)local_288.begin.x * -8 + lVar15) -
                                   (dVar29 - *(double *)
                                              ((long)local_188.p +
                                              lVar23 * 8 +
                                              (iVar2 - local_188.begin.z) * lVar13 + lVar21 + lVar16
                                              + lVar10 * -8 + lVar15)) *
                                   *(double *)
                                    ((long)local_288.p +
                                    lVar23 * 8 +
                                    (lVar20 - local_288.begin.z) * local_288.kstride * 8 +
                                    lVar14 * 8 + local_288.nstride * local_408 +
                                    (long)local_288.begin.x * -8 + lVar15)) * local_e8 +
                                   ((*(double *)
                                      ((long)local_188.p +
                                      lVar23 * 8 +
                                      (local_370 - local_188.begin.y) * lVar19 + lVar17 + lVar16 +
                                      lVar10 * -8 + lVar15) - dVar29) *
                                    *(double *)
                                     ((long)local_248.p +
                                     lVar23 * 8 +
                                     (local_370 - local_248.begin.y) * local_248.jstride * 8 +
                                     lVar26 * 8 + local_248.nstride * local_408 +
                                     (long)local_248.begin.x * -8 + lVar15) -
                                   (dVar29 - *(double *)
                                              ((long)local_188.p +
                                              lVar23 * 8 +
                                              lVar17 + lVar16 + (iVar1 - local_188.begin.y) * lVar19
                                              + lVar10 * -8 + lVar15)) *
                                   *(double *)
                                    ((long)local_248.p +
                                    lVar23 * 8 +
                                    lVar26 * 8 +
                                    (local_440 - local_248.begin.y) * local_248.jstride * 8 +
                                    local_248.nstride * local_408 + (long)local_248.begin.x * -8 +
                                    lVar15)) * local_108 +
                                   local_148.p
                                   [lVar12 + (((lVar20 - local_148.begin.z) * local_148.kstride +
                                              (local_440 - local_148.begin.y) * local_148.jstride +
                                              lVar23) - (long)local_148.begin.x)] * local_2e0 *
                                   dVar29 + ((*(double *)
                                               ((long)local_188.p + lVar23 * 8 + lVar25 + 8) -
                                             dVar29) * *(double *)
                                                        ((long)local_208.p + lVar23 * 8 + lVar18 + 8
                                                        ) -
                                            (dVar29 - local_2f8[((local_314.smallend.vect[0] + -1) -
                                                                local_188.begin.x) + (int)lVar23]) *
                                            *(double *)((long)local_208.p + lVar23 * 8 + lVar18)) *
                                            local_f8;
                        }
                        local_1c8.p
                        [(local_440 - local_1c8.begin.y) * local_1c8.jstride +
                         (lVar20 - local_1c8.begin.z) * local_1c8.kstride +
                         local_1c8.nstride * local_3e0 +
                         ((lVar12 + lVar23) - (long)local_1c8.begin.x)] = dVar29;
                        lVar23 = lVar23 + 1;
                      } while ((local_314.bigend.vect[0] - local_314.smallend.vect[0]) + 1 !=
                               (int)lVar23);
                    }
                    local_440 = local_440 + 1;
                    iVar1 = iVar1 + 1;
                    local_3d8 = local_3d8 + local_d0.jstride * 4;
                  } while (local_314.bigend.vect[1] + 1 != (int)local_440);
                }
                iVar2 = iVar2 + 1;
                bVar28 = iVar6 != local_314.bigend.vect[2];
                iVar6 = iVar6 + 1;
              } while (bVar28);
            }
            local_3e0 = local_3e0 + 1;
            local_408 = local_408 + 8;
          } while (local_3e0 != local_2d8);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLABecLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLABecLaplacian::Fapply()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && out.isFusingCandidate()) {
        const auto& xma = in.const_arrays();
        const auto& yma = out.arrays();
        const auto& ama = acoef.arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx_os(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                   AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                   osmma[box_no], dxinv, ascalar, bscalar);
            });
        } else {
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
            });
        }
        Gpu::streamSynchronize();
    }